

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  void *pvVar2;
  rnnvalue *prVar3;
  rnnbitfield *prVar4;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int i;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  *in_RDI = *in_RSI;
  *(undefined4 *)(in_RDI + 9) = *(undefined4 *)(in_RSI + 9);
  in_RDI[10] = in_RSI[10];
  in_RDI[0xb] = in_RSI[0xb];
  in_RDI[0xc] = in_RSI[0xc];
  for (iVar5 = 0; iVar5 < *(int *)(in_RSI + 8); iVar5 = iVar5 + 1) {
    if (*(int *)((long)in_RDI + 0x44) <= *(int *)(in_RDI + 8)) {
      if (*(int *)((long)in_RDI + 0x44) == 0) {
        *(undefined4 *)((long)in_RDI + 0x44) = 0x10;
      }
      else {
        *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0x44) << 1;
      }
      pvVar2 = realloc((void *)in_RDI[7],(long)*(int *)((long)in_RDI + 0x44) << 3);
      in_RDI[7] = pvVar2;
    }
    prVar3 = copyvalue((rnnvalue *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    iVar1 = *(int *)(in_RDI + 8);
    *(int *)(in_RDI + 8) = iVar1 + 1;
    *(rnnvalue **)(in_RDI[7] + (long)iVar1 * 8) = prVar3;
  }
  for (iVar5 = 0; iVar5 < *(int *)(in_RSI + 6); iVar5 = iVar5 + 1) {
    if (*(int *)((long)in_RDI + 0x34) <= *(int *)(in_RDI + 6)) {
      if (*(int *)((long)in_RDI + 0x34) == 0) {
        *(undefined4 *)((long)in_RDI + 0x34) = 0x10;
      }
      else {
        *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) << 1;
      }
      pvVar2 = realloc((void *)in_RDI[5],(long)*(int *)((long)in_RDI + 0x34) << 3);
      in_RDI[5] = pvVar2;
    }
    prVar4 = copybitfield((rnnbitfield *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
    iVar1 = *(int *)(in_RDI + 6);
    *(int *)(in_RDI + 6) = iVar1 + 1;
    *(rnnbitfield **)(in_RDI[5] + (long)iVar1 * 8) = prVar4;
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	dst->shr = src->shr;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}